

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O3

void Gia_ManFindCaninicalOrder_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vAnds)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  
  pGVar1 = p->pObjs;
  if ((pObj < pGVar1) || (pGVar1 + p->nObjs <= pObj)) goto LAB_00752def;
  iVar2 = (int)((long)pObj - (long)pGVar1 >> 2) * -0x55555555;
  if (p->nTravIdsAlloc <= iVar2) {
    __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x263,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
  }
  if (p->pTravIds[iVar2] == p->nTravIds) {
    return;
  }
  p->pTravIds[iVar2] = p->nTravIds;
  uVar4 = (uint)*(undefined8 *)pObj;
  if (((int)uVar4 < 0) || (uVar4 = uVar4 & 0x1fffffff, uVar4 == 0x1fffffff)) {
    __assert_fail("Gia_ObjIsAnd(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIso.c"
                  ,0x35c,"void Gia_ManFindCaninicalOrder_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)"
                 );
  }
  pGVar1 = pObj + -(ulong)uVar4;
  if (((~*(uint *)pGVar1 & 0x1fffffff) == 0 || (int)*(uint *)pGVar1 < 0) ||
     (uVar3 = (ulong)((uint)((ulong)*(undefined8 *)pObj >> 0x20) & 0x1fffffff),
     (int)*(uint *)(pObj + -uVar3) < 0 || (~*(uint *)(pObj + -uVar3) & 0x1fffffff) == 0)) {
LAB_00752d7d:
    Gia_ManFindCaninicalOrder_rec(p,pGVar1,vAnds);
    uVar4 = *(uint *)&pObj->field_0x4;
  }
  else {
    uVar4 = pObj[-uVar3].Value;
    if (pGVar1->Value == uVar4) {
      __assert_fail("Gia_ObjFanin0(pObj)->Value != Gia_ObjFanin1(pObj)->Value",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIso.c"
                    ,0x364,
                    "void Gia_ManFindCaninicalOrder_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
    }
    if (pGVar1->Value < uVar4) goto LAB_00752d7d;
    Gia_ManFindCaninicalOrder_rec(p,pObj + -uVar3,vAnds);
    uVar4 = (uint)*(undefined8 *)pObj;
  }
  Gia_ManFindCaninicalOrder_rec(p,pObj + -(ulong)(uVar4 & 0x1fffffff),vAnds);
  pGVar1 = p->pObjs;
  if ((pGVar1 <= pObj) && (pObj < pGVar1 + p->nObjs)) {
    Vec_IntPush(vAnds,(int)((ulong)((long)pObj - (long)pGVar1) >> 2) * -0x55555555);
    return;
  }
LAB_00752def:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Gia_ManFindCaninicalOrder_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vAnds )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return;
    Gia_ObjSetTravIdCurrent(p, pObj);
    assert( Gia_ObjIsAnd(pObj) );
    if ( !Gia_ObjIsAnd(Gia_ObjFanin0(pObj)) || !Gia_ObjIsAnd(Gia_ObjFanin1(pObj)) )
    {
        Gia_ManFindCaninicalOrder_rec( p, Gia_ObjFanin0(pObj), vAnds );
        Gia_ManFindCaninicalOrder_rec( p, Gia_ObjFanin1(pObj), vAnds );
    }
    else
    {
        assert( Gia_ObjFanin0(pObj)->Value != Gia_ObjFanin1(pObj)->Value );
        if ( Gia_ObjFanin0(pObj)->Value < Gia_ObjFanin1(pObj)->Value )
        {
            Gia_ManFindCaninicalOrder_rec( p, Gia_ObjFanin0(pObj), vAnds );
            Gia_ManFindCaninicalOrder_rec( p, Gia_ObjFanin1(pObj), vAnds );
        }
        else
        {
            Gia_ManFindCaninicalOrder_rec( p, Gia_ObjFanin1(pObj), vAnds );
            Gia_ManFindCaninicalOrder_rec( p, Gia_ObjFanin0(pObj), vAnds );
        }
    }
    Vec_IntPush( vAnds, Gia_ObjId(p, pObj) );
}